

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O3

int Abc_NtkRenodeEvalSop(If_Man_t *p,If_Cut_t *pCut)

{
  uint uVar1;
  word *puTruth;
  Vec_Mem_t *pVVar2;
  uint uVar3;
  int iVar4;
  word *pwVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar7 = *(uint *)&pCut->field_0x1c >> 0x18;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    memset(&pCut[1].Area + uVar7,1,(ulong)(uVar7 - 1) + 1);
  }
  uVar1 = pCut->iCutFunc;
  if ((int)uVar1 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  puTruth = p->puTempW;
  pVVar2 = p->vTtMem[uVar7];
  if (pVVar2 == (Vec_Mem_t *)0x0) {
    pwVar5 = (word *)0x0;
  }
  else {
    uVar3 = uVar1 >> 1;
    if (pVVar2->nEntries <= (int)uVar3) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar5 = pVVar2->ppPages[uVar3 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
             (ulong)(uVar3 & pVVar2->PageMask) * (long)pVVar2->nEntrySize;
  }
  uVar7 = p->nTruth6Words[uVar7];
  if ((uVar1 & 1) == 0) {
    if (0 < (int)uVar7) {
      uVar6 = 0;
      do {
        puTruth[uVar6] = pwVar5[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
  }
  else if (0 < (int)uVar7) {
    uVar6 = 0;
    do {
      puTruth[uVar6] = ~pwVar5[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  uVar7 = Kit_TruthIsop((uint *)puTruth,(uint)(byte)pCut->field_0x1f,s_vMemory,1);
  if (uVar7 == 0xffffffff) {
    iVar4 = 0xfff;
  }
  else {
    if (1 < uVar7) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,0xee,"int Abc_NtkRenodeEvalSop(If_Man_t *, If_Cut_t *)");
    }
    iVar4 = s_vMemory->nSize;
  }
  return iVar4;
}

Assistant:

int Abc_NtkRenodeEvalSop( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int i, RetValue;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = 1;
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 1 );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    return Vec_IntSize( s_vMemory );
}